

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void idct32_sse2(__m128i *input,__m128i *output)

{
  __m128i alVar1;
  __m128i alVar2;
  __m128i alVar3;
  __m128i alVar4;
  longlong lVar5;
  longlong lVar6;
  longlong lVar7;
  longlong lVar8;
  longlong lVar9;
  longlong lVar10;
  longlong lVar11;
  longlong lVar12;
  longlong lVar13;
  longlong lVar14;
  longlong lVar15;
  longlong lVar16;
  longlong lVar17;
  longlong lVar18;
  longlong lVar19;
  longlong lVar20;
  longlong lVar21;
  longlong lVar22;
  longlong lVar23;
  __m128i alVar24;
  __m128i alVar25;
  longlong lVar26;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  int32_t *cospi;
  int8_t cos_bit;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  __m128i alVar178;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  __m128i alVar204;
  __m128i alVar205;
  __m128i alVar206;
  __m128i alVar207;
  undefined2 local_2d8;
  undefined2 uStack_2d6;
  undefined2 uStack_2d4;
  undefined2 uStack_2d2;
  undefined2 uStack_2d0;
  undefined2 uStack_2ce;
  undefined2 uStack_2cc;
  undefined2 uStack_2ca;
  undefined2 local_2a8;
  undefined2 uStack_2a6;
  undefined2 uStack_2a4;
  undefined2 uStack_2a2;
  undefined2 uStack_2a0;
  undefined2 uStack_29e;
  undefined2 uStack_29c;
  undefined2 uStack_29a;
  undefined2 local_298;
  undefined2 uStack_296;
  undefined2 uStack_294;
  undefined2 uStack_292;
  undefined2 uStack_290;
  undefined2 uStack_28e;
  undefined2 uStack_28c;
  undefined2 uStack_28a;
  undefined2 local_288;
  undefined2 uStack_286;
  undefined2 uStack_284;
  undefined2 uStack_282;
  undefined2 uStack_280;
  undefined2 uStack_27e;
  undefined2 uStack_27c;
  undefined2 uStack_27a;
  undefined2 local_278;
  undefined2 uStack_276;
  undefined2 uStack_274;
  undefined2 uStack_272;
  undefined2 uStack_270;
  undefined2 uStack_26e;
  undefined2 uStack_26c;
  undefined2 uStack_26a;
  undefined2 local_268;
  undefined2 uStack_266;
  undefined2 uStack_264;
  undefined2 uStack_262;
  undefined2 uStack_260;
  undefined2 uStack_25e;
  undefined2 uStack_25c;
  undefined2 uStack_25a;
  undefined2 local_258;
  undefined2 uStack_256;
  undefined2 uStack_254;
  undefined2 uStack_252;
  undefined2 uStack_250;
  undefined2 uStack_24e;
  undefined2 uStack_24c;
  undefined2 uStack_24a;
  undefined2 local_248;
  undefined2 uStack_246;
  undefined2 uStack_244;
  undefined2 uStack_242;
  undefined2 uStack_240;
  undefined2 uStack_23e;
  undefined2 uStack_23c;
  undefined2 uStack_23a;
  __m128i local_238;
  undefined1 local_228 [4];
  undefined2 uStack_224;
  undefined2 uStack_222;
  undefined2 uStack_220;
  undefined2 uStack_21e;
  undefined2 uStack_21c;
  undefined2 uStack_21a;
  __m128i local_218;
  undefined1 local_208 [4];
  undefined2 uStack_204;
  undefined2 uStack_202;
  undefined2 uStack_200;
  undefined2 uStack_1fe;
  undefined2 uStack_1fc;
  undefined2 uStack_1fa;
  __m128i local_1f8;
  __m128i local_1e8;
  undefined1 local_1d8 [4];
  undefined2 uStack_1d4;
  undefined2 uStack_1d2;
  undefined2 uStack_1d0;
  undefined2 uStack_1ce;
  undefined2 uStack_1cc;
  undefined2 uStack_1ca;
  undefined1 local_1c8 [4];
  undefined2 uStack_1c4;
  undefined2 uStack_1c2;
  undefined2 uStack_1c0;
  undefined2 uStack_1be;
  undefined2 uStack_1bc;
  undefined2 uStack_1ba;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  undefined1 auVar32 [16];
  undefined1 auVar37 [16];
  undefined1 auVar42 [16];
  undefined1 auVar47 [16];
  undefined1 auVar52 [16];
  undefined1 auVar57 [16];
  undefined1 auVar62 [16];
  undefined1 auVar67 [16];
  undefined1 auVar72 [16];
  undefined1 auVar33 [16];
  undefined1 auVar38 [16];
  undefined1 auVar43 [16];
  undefined1 auVar48 [16];
  undefined1 auVar53 [16];
  undefined1 auVar58 [16];
  undefined1 auVar63 [16];
  undefined1 auVar68 [16];
  undefined1 auVar73 [16];
  undefined1 auVar29 [16];
  undefined1 auVar34 [16];
  undefined1 auVar39 [16];
  undefined1 auVar44 [16];
  undefined1 auVar49 [16];
  undefined1 auVar54 [16];
  undefined1 auVar59 [16];
  undefined1 auVar64 [16];
  undefined1 auVar69 [16];
  undefined1 auVar74 [16];
  undefined1 auVar101 [16];
  undefined1 auVar107 [16];
  undefined1 auVar130 [16];
  undefined1 auVar137 [16];
  undefined1 auVar102 [16];
  undefined1 auVar108 [16];
  undefined1 auVar131 [16];
  undefined1 auVar138 [16];
  undefined1 auVar103 [16];
  undefined1 auVar109 [16];
  undefined1 auVar132 [16];
  undefined1 auVar139 [16];
  undefined1 auVar155 [16];
  undefined1 auVar161 [16];
  undefined1 auVar156 [16];
  undefined1 auVar162 [16];
  undefined1 auVar157 [16];
  undefined1 auVar163 [16];
  
  local_238 = *input;
  _local_228 = input[0x10];
  local_218 = input[8];
  _local_208 = input[0x18];
  local_1f8 = input[4];
  local_1e8 = input[0x14];
  _local_1d8 = input[0xc];
  _local_1c8 = input[0x1c];
  alVar178 = input[0x12];
  lVar26 = input[10][0];
  lVar5 = input[10][1];
  alVar24 = input[10];
  lVar6 = input[0x1a][0];
  lVar7 = input[0x1a][1];
  alVar25 = input[0x1a];
  lVar8 = input[6][0];
  lVar9 = input[6][1];
  lVar10 = input[0x16][0];
  lVar11 = input[0x16][1];
  lVar12 = input[0xe][0];
  lVar13 = input[0xe][1];
  lVar14 = input[0x1e][0];
  lVar15 = input[0x1e][1];
  alVar204 = input[0x11];
  alVar205 = input[9];
  alVar206 = input[0x19];
  alVar207 = input[1];
  alVar1 = input[2];
  auVar103._0_12_ = alVar207._0_12_;
  auVar103._12_2_ = alVar207[0]._6_2_;
  auVar103._14_2_ = *(undefined2 *)((long)input[0x1f] + 6);
  auVar102._12_4_ = auVar103._12_4_;
  auVar102._0_10_ = alVar207._0_10_;
  auVar102._10_2_ = *(undefined2 *)((long)input[0x1f] + 4);
  auVar101._10_6_ = auVar102._10_6_;
  auVar101._0_8_ = alVar207[0];
  auVar101._8_2_ = alVar207[0]._4_2_;
  auVar100._8_8_ = auVar101._8_8_;
  auVar100._6_2_ = *(undefined2 *)((long)input[0x1f] + 2);
  auVar100._4_2_ = alVar207[0]._2_2_;
  auVar100._0_2_ = (undefined2)alVar207[0];
  auVar100._2_2_ = (short)input[0x1f][0];
  auVar141._2_2_ = (short)input[0x1f][1];
  auVar141._0_2_ = (short)alVar207[1];
  auVar141._4_2_ = alVar207[1]._2_2_;
  auVar141._6_2_ = *(undefined2 *)((long)input[0x1f] + 10);
  auVar141._8_2_ = alVar207[1]._4_2_;
  auVar141._10_2_ = *(undefined2 *)((long)input[0x1f] + 0xc);
  auVar141._12_2_ = alVar207[1]._6_2_;
  auVar141._14_2_ = *(undefined2 *)((long)input[0x1f] + 0xe);
  auVar179._8_4_ = 0xf00500c9;
  auVar179._0_8_ = 0xf00500c9f00500c9;
  auVar179._12_4_ = 0xf00500c9;
  auVar27 = pmaddwd(auVar100,auVar179);
  auVar180 = pmaddwd(auVar179,auVar141);
  auVar188._8_4_ = 0xc90ffb;
  auVar188._0_8_ = 0xc90ffb00c90ffb;
  auVar188._12_4_ = 0xc90ffb;
  auVar104 = pmaddwd(auVar100,auVar188);
  auVar142 = pmaddwd(auVar141,auVar188);
  auVar80._0_4_ = auVar27._0_4_ + 0x800 >> 0xc;
  auVar80._4_4_ = auVar27._4_4_ + 0x800 >> 0xc;
  auVar80._8_4_ = auVar27._8_4_ + 0x800 >> 0xc;
  auVar80._12_4_ = auVar27._12_4_ + 0x800 >> 0xc;
  auVar181._0_4_ = auVar180._0_4_ + 0x800 >> 0xc;
  auVar181._4_4_ = auVar180._4_4_ + 0x800 >> 0xc;
  auVar181._8_4_ = auVar180._8_4_ + 0x800 >> 0xc;
  auVar181._12_4_ = auVar180._12_4_ + 0x800 >> 0xc;
  local_138 = packssdw(auVar80,auVar181);
  lVar16 = input[3][0];
  lVar17 = input[3][1];
  auVar105._0_4_ = auVar104._0_4_ + 0x800 >> 0xc;
  auVar105._4_4_ = auVar104._4_4_ + 0x800 >> 0xc;
  auVar105._8_4_ = auVar104._8_4_ + 0x800 >> 0xc;
  auVar105._12_4_ = auVar104._12_4_ + 0x800 >> 0xc;
  auVar143._0_4_ = auVar142._0_4_ + 0x800 >> 0xc;
  auVar143._4_4_ = auVar142._4_4_ + 0x800 >> 0xc;
  auVar143._8_4_ = auVar142._8_4_ + 0x800 >> 0xc;
  auVar143._12_4_ = auVar142._12_4_ + 0x800 >> 0xc;
  local_48 = packssdw(auVar105,auVar143);
  alVar207 = input[5];
  alVar2 = input[0x15];
  alVar3 = input[0xd];
  alVar4 = input[0x1d];
  lVar18 = input[0x13][0];
  lVar19 = input[0x13][1];
  lVar20 = input[0xb][0];
  lVar21 = input[0xb][1];
  lVar22 = input[0x1b][0];
  lVar23 = input[0x1b][1];
  auVar109._0_12_ = alVar204._0_12_;
  auVar109._12_2_ = alVar204[0]._6_2_;
  auVar109._14_2_ = *(undefined2 *)((long)input[0xf] + 6);
  auVar108._12_4_ = auVar109._12_4_;
  auVar108._0_10_ = alVar204._0_10_;
  auVar108._10_2_ = *(undefined2 *)((long)input[0xf] + 4);
  auVar107._10_6_ = auVar108._10_6_;
  auVar107._0_8_ = alVar204[0];
  auVar107._8_2_ = alVar204[0]._4_2_;
  auVar106._8_8_ = auVar107._8_8_;
  auVar106._6_2_ = *(undefined2 *)((long)input[0xf] + 2);
  auVar106._4_2_ = alVar204[0]._2_2_;
  auVar106._0_2_ = (undefined2)alVar204[0];
  auVar106._2_2_ = (short)input[0xf][0];
  auVar166._2_2_ = (short)input[0xf][1];
  auVar166._0_2_ = (short)alVar204[1];
  auVar166._4_2_ = alVar204[1]._2_2_;
  auVar166._6_2_ = *(undefined2 *)((long)input[0xf] + 10);
  auVar166._8_2_ = alVar204[1]._4_2_;
  auVar166._10_2_ = *(undefined2 *)((long)input[0xf] + 0xc);
  auVar166._12_2_ = alVar204[1]._6_2_;
  auVar166._14_2_ = *(undefined2 *)((long)input[0xf] + 0xe);
  auVar27._8_4_ = 0xf5410bdb;
  auVar27._0_8_ = 0xf5410bdbf5410bdb;
  auVar27._12_4_ = 0xf5410bdb;
  auVar80 = pmaddwd(auVar106,auVar27);
  auVar27 = pmaddwd(auVar27,auVar166);
  auVar199._8_4_ = 0xbdb0abf;
  auVar199._0_8_ = 0xbdb0abf0bdb0abf;
  auVar199._12_4_ = 0xbdb0abf;
  auVar142 = pmaddwd(auVar106,auVar199);
  auVar180 = pmaddwd(auVar166,auVar199);
  auVar81._0_4_ = auVar80._0_4_ + 0x800 >> 0xc;
  auVar81._4_4_ = auVar80._4_4_ + 0x800 >> 0xc;
  auVar81._8_4_ = auVar80._8_4_ + 0x800 >> 0xc;
  auVar81._12_4_ = auVar80._12_4_ + 0x800 >> 0xc;
  auVar104._0_4_ = auVar27._0_4_ + 0x800 >> 0xc;
  auVar104._4_4_ = auVar27._4_4_ + 0x800 >> 0xc;
  auVar104._8_4_ = auVar27._8_4_ + 0x800 >> 0xc;
  auVar104._12_4_ = auVar27._12_4_ + 0x800 >> 0xc;
  local_128 = packssdw(auVar81,auVar104);
  auVar110._0_4_ = auVar142._0_4_ + 0x800 >> 0xc;
  auVar110._4_4_ = auVar142._4_4_ + 0x800 >> 0xc;
  auVar110._8_4_ = auVar142._8_4_ + 0x800 >> 0xc;
  auVar110._12_4_ = auVar142._12_4_ + 0x800 >> 0xc;
  auVar167._0_4_ = auVar180._0_4_ + 0x800 >> 0xc;
  auVar167._4_4_ = auVar180._4_4_ + 0x800 >> 0xc;
  auVar167._8_4_ = auVar180._8_4_ + 0x800 >> 0xc;
  auVar167._12_4_ = auVar180._12_4_ + 0x800 >> 0xc;
  local_58 = packssdw(auVar110,auVar167);
  auVar29._0_12_ = alVar205._0_12_;
  auVar29._12_2_ = alVar205[0]._6_2_;
  auVar29._14_2_ = *(undefined2 *)((long)input[0x17] + 6);
  auVar28._12_4_ = auVar29._12_4_;
  auVar28._0_10_ = alVar205._0_10_;
  auVar28._10_2_ = *(undefined2 *)((long)input[0x17] + 4);
  auVar180._10_6_ = auVar28._10_6_;
  auVar180._0_8_ = alVar205[0];
  auVar180._8_2_ = alVar205[0]._4_2_;
  auVar142._8_8_ = auVar180._8_8_;
  auVar142._6_2_ = *(undefined2 *)((long)input[0x17] + 2);
  auVar142._4_2_ = alVar205[0]._2_2_;
  auVar142._0_2_ = (undefined2)alVar205[0];
  auVar142._2_2_ = (short)input[0x17][0];
  auVar184._2_2_ = (short)input[0x17][1];
  auVar184._0_2_ = (short)alVar205[1];
  auVar184._4_2_ = alVar205[1]._2_2_;
  auVar184._6_2_ = *(undefined2 *)((long)input[0x17] + 10);
  auVar184._8_2_ = alVar205[1]._4_2_;
  auVar184._10_2_ = *(undefined2 *)((long)input[0x17] + 0xc);
  auVar184._12_2_ = alVar205[1]._6_2_;
  auVar184._14_2_ = *(undefined2 *)((long)input[0x17] + 0xe);
  auVar82._8_4_ = 0xf18906d7;
  auVar82._0_8_ = 0xf18906d7f18906d7;
  auVar82._12_4_ = 0xf18906d7;
  auVar104 = pmaddwd(auVar142,auVar82);
  auVar80 = pmaddwd(auVar82,auVar184);
  auVar144._8_4_ = 0x6d70e77;
  auVar144._0_8_ = 0x6d70e7706d70e77;
  auVar144._12_4_ = 0x6d70e77;
  auVar27 = pmaddwd(auVar142,auVar144);
  auVar142 = pmaddwd(auVar184,auVar144);
  auVar111._0_4_ = auVar104._0_4_ + 0x800 >> 0xc;
  auVar111._4_4_ = auVar104._4_4_ + 0x800 >> 0xc;
  auVar111._8_4_ = auVar104._8_4_ + 0x800 >> 0xc;
  auVar111._12_4_ = auVar104._12_4_ + 0x800 >> 0xc;
  auVar83._0_4_ = auVar80._0_4_ + 0x800 >> 0xc;
  auVar83._4_4_ = auVar80._4_4_ + 0x800 >> 0xc;
  auVar83._8_4_ = auVar80._8_4_ + 0x800 >> 0xc;
  auVar83._12_4_ = auVar80._12_4_ + 0x800 >> 0xc;
  local_118 = packssdw(auVar111,auVar83);
  auVar30._0_4_ = auVar27._0_4_ + 0x800 >> 0xc;
  auVar30._4_4_ = auVar27._4_4_ + 0x800 >> 0xc;
  auVar30._8_4_ = auVar27._8_4_ + 0x800 >> 0xc;
  auVar30._12_4_ = auVar27._12_4_ + 0x800 >> 0xc;
  auVar185._0_4_ = auVar142._0_4_ + 0x800 >> 0xc;
  auVar185._4_4_ = auVar142._4_4_ + 0x800 >> 0xc;
  auVar185._8_4_ = auVar142._8_4_ + 0x800 >> 0xc;
  auVar185._12_4_ = auVar142._12_4_ + 0x800 >> 0xc;
  local_68 = packssdw(auVar30,auVar185);
  auVar34._0_12_ = alVar206._0_12_;
  auVar34._12_2_ = alVar206[0]._6_2_;
  auVar34._14_2_ = *(undefined2 *)((long)input[7] + 6);
  auVar33._12_4_ = auVar34._12_4_;
  auVar33._0_10_ = alVar206._0_10_;
  auVar33._10_2_ = *(undefined2 *)((long)input[7] + 4);
  auVar32._10_6_ = auVar33._10_6_;
  auVar32._0_8_ = alVar206[0];
  auVar32._8_2_ = alVar206[0]._4_2_;
  auVar31._8_8_ = auVar32._8_8_;
  auVar31._6_2_ = *(undefined2 *)((long)input[7] + 2);
  auVar31._4_2_ = alVar206[0]._2_2_;
  auVar31._0_2_ = (undefined2)alVar206[0];
  auVar31._2_2_ = (short)input[7][0];
  auVar200._2_2_ = (short)input[7][1];
  auVar200._0_2_ = (short)alVar206[1];
  auVar200._4_2_ = alVar206[1]._2_2_;
  auVar200._6_2_ = *(undefined2 *)((long)input[7] + 10);
  auVar200._8_2_ = alVar206[1]._4_2_;
  auVar200._10_2_ = *(undefined2 *)((long)input[7] + 0xc);
  auVar200._12_2_ = alVar206[1]._6_2_;
  auVar200._14_2_ = *(undefined2 *)((long)input[7] + 0xe);
  auVar84._8_4_ = 0xfa9c0f11;
  auVar84._0_8_ = 0xfa9c0f11fa9c0f11;
  auVar84._12_4_ = 0xfa9c0f11;
  auVar104 = pmaddwd(auVar31,auVar84);
  auVar80 = pmaddwd(auVar84,auVar200);
  auVar145._8_4_ = 0xf110564;
  auVar145._0_8_ = 0xf1105640f110564;
  auVar145._12_4_ = 0xf110564;
  auVar27 = pmaddwd(auVar31,auVar145);
  auVar142 = pmaddwd(auVar200,auVar145);
  auVar112._0_4_ = auVar104._0_4_ + 0x800 >> 0xc;
  auVar112._4_4_ = auVar104._4_4_ + 0x800 >> 0xc;
  auVar112._8_4_ = auVar104._8_4_ + 0x800 >> 0xc;
  auVar112._12_4_ = auVar104._12_4_ + 0x800 >> 0xc;
  auVar85._0_4_ = auVar80._0_4_ + 0x800 >> 0xc;
  auVar85._4_4_ = auVar80._4_4_ + 0x800 >> 0xc;
  auVar85._8_4_ = auVar80._8_4_ + 0x800 >> 0xc;
  auVar85._12_4_ = auVar80._12_4_ + 0x800 >> 0xc;
  local_108 = packssdw(auVar112,auVar85);
  auVar35._0_4_ = auVar27._0_4_ + 0x800 >> 0xc;
  auVar35._4_4_ = auVar27._4_4_ + 0x800 >> 0xc;
  auVar35._8_4_ = auVar27._8_4_ + 0x800 >> 0xc;
  auVar35._12_4_ = auVar27._12_4_ + 0x800 >> 0xc;
  auVar201._0_4_ = auVar142._0_4_ + 0x800 >> 0xc;
  auVar201._4_4_ = auVar142._4_4_ + 0x800 >> 0xc;
  auVar201._8_4_ = auVar142._8_4_ + 0x800 >> 0xc;
  auVar201._12_4_ = auVar142._12_4_ + 0x800 >> 0xc;
  local_78 = packssdw(auVar35,auVar201);
  local_2a8 = (undefined2)lVar22;
  uStack_2a6 = (undefined2)((ulong)lVar22 >> 0x10);
  uStack_2a4 = (undefined2)((ulong)lVar22 >> 0x20);
  uStack_2a2 = (undefined2)((ulong)lVar22 >> 0x30);
  uStack_2a0 = (undefined2)lVar23;
  uStack_29e = (undefined2)((ulong)lVar23 >> 0x10);
  uStack_29c = (undefined2)((ulong)lVar23 >> 0x20);
  uStack_29a = (undefined2)((ulong)lVar23 >> 0x30);
  auVar39._0_12_ = alVar207._0_12_;
  auVar39._12_2_ = alVar207[0]._6_2_;
  auVar39._14_2_ = uStack_2a2;
  auVar38._12_4_ = auVar39._12_4_;
  auVar38._0_10_ = alVar207._0_10_;
  auVar38._10_2_ = uStack_2a4;
  auVar37._10_6_ = auVar38._10_6_;
  auVar37._0_8_ = alVar207[0];
  auVar37._8_2_ = alVar207[0]._4_2_;
  auVar36._8_8_ = auVar37._8_8_;
  auVar36._6_2_ = uStack_2a6;
  auVar36._4_2_ = alVar207[0]._2_2_;
  auVar36._0_2_ = (undefined2)alVar207[0];
  auVar36._2_2_ = local_2a8;
  auVar202._2_2_ = uStack_2a0;
  auVar202._0_2_ = (short)alVar207[1];
  auVar202._4_2_ = alVar207[1]._2_2_;
  auVar202._6_2_ = uStack_29e;
  auVar202._8_2_ = alVar207[1]._4_2_;
  auVar202._10_2_ = uStack_29c;
  auVar202._12_2_ = alVar207[1]._6_2_;
  auVar202._14_2_ = uStack_29a;
  auVar86._8_4_ = 0xf07b03e3;
  auVar86._0_8_ = 0xf07b03e3f07b03e3;
  auVar86._12_4_ = 0xf07b03e3;
  auVar104 = pmaddwd(auVar36,auVar86);
  auVar80 = pmaddwd(auVar86,auVar202);
  auVar146._8_4_ = 0x3e30f85;
  auVar146._0_8_ = 0x3e30f8503e30f85;
  auVar146._12_4_ = 0x3e30f85;
  auVar27 = pmaddwd(auVar36,auVar146);
  auVar142 = pmaddwd(auVar202,auVar146);
  auVar113._0_4_ = auVar104._0_4_ + 0x800 >> 0xc;
  auVar113._4_4_ = auVar104._4_4_ + 0x800 >> 0xc;
  auVar113._8_4_ = auVar104._8_4_ + 0x800 >> 0xc;
  auVar113._12_4_ = auVar104._12_4_ + 0x800 >> 0xc;
  auVar87._0_4_ = auVar80._0_4_ + 0x800 >> 0xc;
  auVar87._4_4_ = auVar80._4_4_ + 0x800 >> 0xc;
  auVar87._8_4_ = auVar80._8_4_ + 0x800 >> 0xc;
  auVar87._12_4_ = auVar80._12_4_ + 0x800 >> 0xc;
  local_f8 = packssdw(auVar113,auVar87);
  auVar40._0_4_ = auVar27._0_4_ + 0x800 >> 0xc;
  auVar40._4_4_ = auVar27._4_4_ + 0x800 >> 0xc;
  auVar40._8_4_ = auVar27._8_4_ + 0x800 >> 0xc;
  auVar40._12_4_ = auVar27._12_4_ + 0x800 >> 0xc;
  auVar203._0_4_ = auVar142._0_4_ + 0x800 >> 0xc;
  auVar203._4_4_ = auVar142._4_4_ + 0x800 >> 0xc;
  auVar203._8_4_ = auVar142._8_4_ + 0x800 >> 0xc;
  auVar203._12_4_ = auVar142._12_4_ + 0x800 >> 0xc;
  local_88 = packssdw(auVar40,auVar203);
  local_298 = (undefined2)lVar20;
  uStack_296 = (undefined2)((ulong)lVar20 >> 0x10);
  uStack_294 = (undefined2)((ulong)lVar20 >> 0x20);
  uStack_292 = (undefined2)((ulong)lVar20 >> 0x30);
  uStack_290 = (undefined2)lVar21;
  uStack_28e = (undefined2)((ulong)lVar21 >> 0x10);
  uStack_28c = (undefined2)((ulong)lVar21 >> 0x20);
  uStack_28a = (undefined2)((ulong)lVar21 >> 0x30);
  auVar44._0_12_ = alVar2._0_12_;
  auVar44._12_2_ = alVar2[0]._6_2_;
  auVar44._14_2_ = uStack_292;
  auVar43._12_4_ = auVar44._12_4_;
  auVar43._0_10_ = alVar2._0_10_;
  auVar43._10_2_ = uStack_294;
  auVar42._10_6_ = auVar43._10_6_;
  auVar42._0_8_ = alVar2[0];
  auVar42._8_2_ = alVar2[0]._4_2_;
  auVar41._8_8_ = auVar42._8_8_;
  auVar41._6_2_ = uStack_296;
  auVar41._4_2_ = alVar2[0]._2_2_;
  auVar41._0_2_ = (undefined2)alVar2[0];
  auVar41._2_2_ = local_298;
  auVar197._2_2_ = uStack_290;
  auVar197._0_2_ = (short)alVar2[1];
  auVar197._4_2_ = alVar2[1]._2_2_;
  auVar197._6_2_ = uStack_28e;
  auVar197._8_2_ = alVar2[1]._4_2_;
  auVar197._10_2_ = uStack_28c;
  auVar197._12_2_ = alVar2[1]._6_2_;
  auVar197._14_2_ = uStack_28a;
  auVar114._8_4_ = 0xf7c60db9;
  auVar114._0_8_ = 0xf7c60db9f7c60db9;
  auVar114._12_4_ = 0xf7c60db9;
  auVar80 = pmaddwd(auVar41,auVar114);
  auVar104 = pmaddwd(auVar114,auVar197);
  auVar147._8_4_ = 0xdb9083a;
  auVar147._0_8_ = 0xdb9083a0db9083a;
  auVar147._12_4_ = 0xdb9083a;
  auVar27 = pmaddwd(auVar41,auVar147);
  auVar142 = pmaddwd(auVar197,auVar147);
  auVar88._0_4_ = auVar80._0_4_ + 0x800 >> 0xc;
  auVar88._4_4_ = auVar80._4_4_ + 0x800 >> 0xc;
  auVar88._8_4_ = auVar80._8_4_ + 0x800 >> 0xc;
  auVar88._12_4_ = auVar80._12_4_ + 0x800 >> 0xc;
  auVar115._0_4_ = auVar104._0_4_ + 0x800 >> 0xc;
  auVar115._4_4_ = auVar104._4_4_ + 0x800 >> 0xc;
  auVar115._8_4_ = auVar104._8_4_ + 0x800 >> 0xc;
  auVar115._12_4_ = auVar104._12_4_ + 0x800 >> 0xc;
  local_e8 = packssdw(auVar88,auVar115);
  auVar45._0_4_ = auVar27._0_4_ + 0x800 >> 0xc;
  auVar45._4_4_ = auVar27._4_4_ + 0x800 >> 0xc;
  auVar45._8_4_ = auVar27._8_4_ + 0x800 >> 0xc;
  auVar45._12_4_ = auVar27._12_4_ + 0x800 >> 0xc;
  auVar198._0_4_ = auVar142._0_4_ + 0x800 >> 0xc;
  auVar198._4_4_ = auVar142._4_4_ + 0x800 >> 0xc;
  auVar198._8_4_ = auVar142._8_4_ + 0x800 >> 0xc;
  auVar198._12_4_ = auVar142._12_4_ + 0x800 >> 0xc;
  local_98 = packssdw(auVar45,auVar198);
  local_288 = (undefined2)lVar18;
  uStack_286 = (undefined2)((ulong)lVar18 >> 0x10);
  uStack_284 = (undefined2)((ulong)lVar18 >> 0x20);
  uStack_282 = (undefined2)((ulong)lVar18 >> 0x30);
  uStack_280 = (undefined2)lVar19;
  uStack_27e = (undefined2)((ulong)lVar19 >> 0x10);
  uStack_27c = (undefined2)((ulong)lVar19 >> 0x20);
  uStack_27a = (undefined2)((ulong)lVar19 >> 0x30);
  auVar49._0_12_ = alVar3._0_12_;
  auVar49._12_2_ = alVar3[0]._6_2_;
  auVar49._14_2_ = uStack_282;
  auVar48._12_4_ = auVar49._12_4_;
  auVar48._0_10_ = alVar3._0_10_;
  auVar48._10_2_ = uStack_284;
  auVar47._10_6_ = auVar48._10_6_;
  auVar47._0_8_ = alVar3[0];
  auVar47._8_2_ = alVar3[0]._4_2_;
  auVar46._8_8_ = auVar47._8_8_;
  auVar46._6_2_ = uStack_286;
  auVar46._4_2_ = alVar3[0]._2_2_;
  auVar46._0_2_ = (undefined2)alVar3[0];
  auVar46._2_2_ = local_288;
  auVar193._2_2_ = uStack_280;
  auVar193._0_2_ = (short)alVar3[1];
  auVar193._4_2_ = alVar3[1]._2_2_;
  auVar193._6_2_ = uStack_27e;
  auVar193._8_2_ = alVar3[1]._4_2_;
  auVar193._10_2_ = uStack_27c;
  auVar193._12_2_ = alVar3[1]._6_2_;
  auVar193._14_2_ = uStack_27a;
  auVar116._8_4_ = 0xf3260988;
  auVar116._0_8_ = 0xf3260988f3260988;
  auVar116._12_4_ = 0xf3260988;
  auVar80 = pmaddwd(auVar46,auVar116);
  auVar104 = pmaddwd(auVar116,auVar193);
  auVar148._8_4_ = 0x9880cda;
  auVar148._0_8_ = 0x9880cda09880cda;
  auVar148._12_4_ = 0x9880cda;
  auVar27 = pmaddwd(auVar46,auVar148);
  auVar142 = pmaddwd(auVar193,auVar148);
  auVar89._0_4_ = auVar80._0_4_ + 0x800 >> 0xc;
  auVar89._4_4_ = auVar80._4_4_ + 0x800 >> 0xc;
  auVar89._8_4_ = auVar80._8_4_ + 0x800 >> 0xc;
  auVar89._12_4_ = auVar80._12_4_ + 0x800 >> 0xc;
  auVar117._0_4_ = auVar104._0_4_ + 0x800 >> 0xc;
  auVar117._4_4_ = auVar104._4_4_ + 0x800 >> 0xc;
  auVar117._8_4_ = auVar104._8_4_ + 0x800 >> 0xc;
  auVar117._12_4_ = auVar104._12_4_ + 0x800 >> 0xc;
  local_d8 = packssdw(auVar89,auVar117);
  auVar50._0_4_ = auVar27._0_4_ + 0x800 >> 0xc;
  auVar50._4_4_ = auVar27._4_4_ + 0x800 >> 0xc;
  auVar50._8_4_ = auVar27._8_4_ + 0x800 >> 0xc;
  auVar50._12_4_ = auVar27._12_4_ + 0x800 >> 0xc;
  auVar194._0_4_ = auVar142._0_4_ + 0x800 >> 0xc;
  auVar194._4_4_ = auVar142._4_4_ + 0x800 >> 0xc;
  auVar194._8_4_ = auVar142._8_4_ + 0x800 >> 0xc;
  auVar194._12_4_ = auVar142._12_4_ + 0x800 >> 0xc;
  local_a8 = packssdw(auVar50,auVar194);
  local_278 = (undefined2)lVar16;
  uStack_276 = (undefined2)((ulong)lVar16 >> 0x10);
  uStack_274 = (undefined2)((ulong)lVar16 >> 0x20);
  uStack_272 = (undefined2)((ulong)lVar16 >> 0x30);
  uStack_270 = (undefined2)lVar17;
  uStack_26e = (undefined2)((ulong)lVar17 >> 0x10);
  uStack_26c = (undefined2)((ulong)lVar17 >> 0x20);
  uStack_26a = (undefined2)((ulong)lVar17 >> 0x30);
  auVar54._0_12_ = alVar4._0_12_;
  auVar54._12_2_ = alVar4[0]._6_2_;
  auVar54._14_2_ = uStack_272;
  auVar53._12_4_ = auVar54._12_4_;
  auVar53._0_10_ = alVar4._0_10_;
  auVar53._10_2_ = uStack_274;
  auVar52._10_6_ = auVar53._10_6_;
  auVar52._0_8_ = alVar4[0];
  auVar52._8_2_ = alVar4[0]._4_2_;
  auVar51._8_8_ = auVar52._8_8_;
  auVar51._6_2_ = uStack_276;
  auVar51._4_2_ = alVar4[0]._2_2_;
  auVar51._0_2_ = (undefined2)alVar4[0];
  auVar51._2_2_ = local_278;
  auVar189._2_2_ = uStack_270;
  auVar189._0_2_ = (short)alVar4[1];
  auVar189._4_2_ = alVar4[1]._2_2_;
  auVar189._6_2_ = uStack_26e;
  auVar189._8_2_ = alVar4[1]._4_2_;
  auVar189._10_2_ = uStack_26c;
  auVar189._12_2_ = alVar4[1]._6_2_;
  auVar189._14_2_ = uStack_26a;
  auVar118._8_4_ = 0xfda70fd4;
  auVar118._0_8_ = 0xfda70fd4fda70fd4;
  auVar118._12_4_ = 0xfda70fd4;
  auVar80 = pmaddwd(auVar51,auVar118);
  auVar104 = pmaddwd(auVar118,auVar189);
  auVar149._8_4_ = 0xfd40259;
  auVar149._0_8_ = 0xfd402590fd40259;
  auVar149._12_4_ = 0xfd40259;
  auVar27 = pmaddwd(auVar51,auVar149);
  auVar142 = pmaddwd(auVar189,auVar149);
  auVar90._0_4_ = auVar80._0_4_ + 0x800 >> 0xc;
  auVar90._4_4_ = auVar80._4_4_ + 0x800 >> 0xc;
  auVar90._8_4_ = auVar80._8_4_ + 0x800 >> 0xc;
  auVar90._12_4_ = auVar80._12_4_ + 0x800 >> 0xc;
  auVar119._0_4_ = auVar104._0_4_ + 0x800 >> 0xc;
  auVar119._4_4_ = auVar104._4_4_ + 0x800 >> 0xc;
  auVar119._8_4_ = auVar104._8_4_ + 0x800 >> 0xc;
  auVar119._12_4_ = auVar104._12_4_ + 0x800 >> 0xc;
  local_c8 = packssdw(auVar90,auVar119);
  auVar55._0_4_ = auVar27._0_4_ + 0x800 >> 0xc;
  auVar55._4_4_ = auVar27._4_4_ + 0x800 >> 0xc;
  auVar55._8_4_ = auVar27._8_4_ + 0x800 >> 0xc;
  auVar55._12_4_ = auVar27._12_4_ + 0x800 >> 0xc;
  auVar190._0_4_ = auVar142._0_4_ + 0x800 >> 0xc;
  auVar190._4_4_ = auVar142._4_4_ + 0x800 >> 0xc;
  auVar190._8_4_ = auVar142._8_4_ + 0x800 >> 0xc;
  auVar190._12_4_ = auVar142._12_4_ + 0x800 >> 0xc;
  local_b8 = packssdw(auVar55,auVar190);
  local_268 = (undefined2)lVar14;
  uStack_266 = (undefined2)((ulong)lVar14 >> 0x10);
  uStack_264 = (undefined2)((ulong)lVar14 >> 0x20);
  uStack_262 = (undefined2)((ulong)lVar14 >> 0x30);
  uStack_260 = (undefined2)lVar15;
  uStack_25e = (undefined2)((ulong)lVar15 >> 0x10);
  uStack_25c = (undefined2)((ulong)lVar15 >> 0x20);
  uStack_25a = (undefined2)((ulong)lVar15 >> 0x30);
  auVar59._0_12_ = alVar1._0_12_;
  auVar59._12_2_ = alVar1[0]._6_2_;
  auVar59._14_2_ = uStack_262;
  auVar58._12_4_ = auVar59._12_4_;
  auVar58._0_10_ = alVar1._0_10_;
  auVar58._10_2_ = uStack_264;
  auVar57._10_6_ = auVar58._10_6_;
  auVar57._0_8_ = alVar1[0];
  auVar57._8_2_ = alVar1[0]._4_2_;
  auVar56._8_8_ = auVar57._8_8_;
  auVar56._6_2_ = uStack_266;
  auVar56._4_2_ = alVar1[0]._2_2_;
  auVar56._0_2_ = (undefined2)alVar1[0];
  auVar56._2_2_ = local_268;
  auVar191._2_2_ = uStack_260;
  auVar191._0_2_ = (short)alVar1[1];
  auVar191._4_2_ = alVar1[1]._2_2_;
  auVar191._6_2_ = uStack_25e;
  auVar191._8_2_ = alVar1[1]._4_2_;
  auVar191._10_2_ = uStack_25c;
  auVar191._12_2_ = alVar1[1]._6_2_;
  auVar191._14_2_ = uStack_25a;
  auVar120._8_4_ = 0xf0140191;
  auVar120._0_8_ = 0xf0140191f0140191;
  auVar120._12_4_ = 0xf0140191;
  auVar80 = pmaddwd(auVar56,auVar120);
  auVar104 = pmaddwd(auVar120,auVar191);
  auVar150._8_4_ = 0x1910fec;
  auVar150._0_8_ = 0x1910fec01910fec;
  auVar150._12_4_ = 0x1910fec;
  auVar27 = pmaddwd(auVar56,auVar150);
  auVar142 = pmaddwd(auVar191,auVar150);
  auVar91._0_4_ = auVar80._0_4_ + 0x800 >> 0xc;
  auVar91._4_4_ = auVar80._4_4_ + 0x800 >> 0xc;
  auVar91._8_4_ = auVar80._8_4_ + 0x800 >> 0xc;
  auVar91._12_4_ = auVar80._12_4_ + 0x800 >> 0xc;
  auVar121._0_4_ = auVar104._0_4_ + 0x800 >> 0xc;
  auVar121._4_4_ = auVar104._4_4_ + 0x800 >> 0xc;
  auVar121._8_4_ = auVar104._8_4_ + 0x800 >> 0xc;
  auVar121._12_4_ = auVar104._12_4_ + 0x800 >> 0xc;
  local_1b8 = packssdw(auVar91,auVar121);
  auVar60._0_4_ = auVar27._0_4_ + 0x800 >> 0xc;
  auVar60._4_4_ = auVar27._4_4_ + 0x800 >> 0xc;
  auVar60._8_4_ = auVar27._8_4_ + 0x800 >> 0xc;
  auVar60._12_4_ = auVar27._12_4_ + 0x800 >> 0xc;
  auVar192._0_4_ = auVar142._0_4_ + 0x800 >> 0xc;
  auVar192._4_4_ = auVar142._4_4_ + 0x800 >> 0xc;
  auVar192._8_4_ = auVar142._8_4_ + 0x800 >> 0xc;
  auVar192._12_4_ = auVar142._12_4_ + 0x800 >> 0xc;
  local_148 = packssdw(auVar60,auVar192);
  local_258 = (undefined2)lVar12;
  uStack_256 = (undefined2)((ulong)lVar12 >> 0x10);
  uStack_254 = (undefined2)((ulong)lVar12 >> 0x20);
  uStack_252 = (undefined2)((ulong)lVar12 >> 0x30);
  uStack_250 = (undefined2)lVar13;
  uStack_24e = (undefined2)((ulong)lVar13 >> 0x10);
  uStack_24c = (undefined2)((ulong)lVar13 >> 0x20);
  uStack_24a = (undefined2)((ulong)lVar13 >> 0x30);
  auVar64._0_12_ = alVar178._0_12_;
  auVar64._12_2_ = alVar178[0]._6_2_;
  auVar64._14_2_ = uStack_252;
  auVar63._12_4_ = auVar64._12_4_;
  auVar63._0_10_ = alVar178._0_10_;
  auVar63._10_2_ = uStack_254;
  auVar62._10_6_ = auVar63._10_6_;
  auVar62._0_8_ = alVar178[0];
  auVar62._8_2_ = alVar178[0]._4_2_;
  auVar61._8_8_ = auVar62._8_8_;
  auVar61._6_2_ = uStack_256;
  auVar61._4_2_ = alVar178[0]._2_2_;
  auVar61._0_2_ = (undefined2)alVar178[0];
  auVar61._2_2_ = local_258;
  auVar195._2_2_ = uStack_250;
  auVar195._0_2_ = (short)alVar178[1];
  auVar195._4_2_ = alVar178[1]._2_2_;
  auVar195._6_2_ = uStack_24e;
  auVar195._8_2_ = alVar178[1]._4_2_;
  auVar195._10_2_ = uStack_24c;
  auVar195._12_2_ = alVar178[1]._6_2_;
  auVar195._14_2_ = uStack_24a;
  auVar122._8_4_ = 0xf5da0c5e;
  auVar122._0_8_ = 0xf5da0c5ef5da0c5e;
  auVar122._12_4_ = 0xf5da0c5e;
  auVar80 = pmaddwd(auVar61,auVar122);
  auVar104 = pmaddwd(auVar122,auVar195);
  auVar151._8_4_ = 0xc5e0a26;
  auVar151._0_8_ = 0xc5e0a260c5e0a26;
  auVar151._12_4_ = 0xc5e0a26;
  auVar27 = pmaddwd(auVar61,auVar151);
  auVar142 = pmaddwd(auVar195,auVar151);
  auVar92._0_4_ = auVar80._0_4_ + 0x800 >> 0xc;
  auVar92._4_4_ = auVar80._4_4_ + 0x800 >> 0xc;
  auVar92._8_4_ = auVar80._8_4_ + 0x800 >> 0xc;
  auVar92._12_4_ = auVar80._12_4_ + 0x800 >> 0xc;
  auVar123._0_4_ = auVar104._0_4_ + 0x800 >> 0xc;
  auVar123._4_4_ = auVar104._4_4_ + 0x800 >> 0xc;
  auVar123._8_4_ = auVar104._8_4_ + 0x800 >> 0xc;
  auVar123._12_4_ = auVar104._12_4_ + 0x800 >> 0xc;
  local_1a8 = packssdw(auVar92,auVar123);
  auVar65._0_4_ = auVar27._0_4_ + 0x800 >> 0xc;
  auVar65._4_4_ = auVar27._4_4_ + 0x800 >> 0xc;
  auVar65._8_4_ = auVar27._8_4_ + 0x800 >> 0xc;
  auVar65._12_4_ = auVar27._12_4_ + 0x800 >> 0xc;
  auVar196._0_4_ = auVar142._0_4_ + 0x800 >> 0xc;
  auVar196._4_4_ = auVar142._4_4_ + 0x800 >> 0xc;
  auVar196._8_4_ = auVar142._8_4_ + 0x800 >> 0xc;
  auVar196._12_4_ = auVar142._12_4_ + 0x800 >> 0xc;
  local_158 = packssdw(auVar65,auVar196);
  local_248 = (undefined2)lVar10;
  uStack_246 = (undefined2)((ulong)lVar10 >> 0x10);
  uStack_244 = (undefined2)((ulong)lVar10 >> 0x20);
  uStack_242 = (undefined2)((ulong)lVar10 >> 0x30);
  uStack_240 = (undefined2)lVar11;
  uStack_23e = (undefined2)((ulong)lVar11 >> 0x10);
  uStack_23c = (undefined2)((ulong)lVar11 >> 0x20);
  uStack_23a = (undefined2)((ulong)lVar11 >> 0x30);
  auVar69._0_12_ = alVar24._0_12_;
  auVar69._12_2_ = (short)((ulong)lVar26 >> 0x30);
  auVar69._14_2_ = uStack_242;
  auVar68._12_4_ = auVar69._12_4_;
  auVar68._0_10_ = alVar24._0_10_;
  auVar68._10_2_ = uStack_244;
  auVar67._10_6_ = auVar68._10_6_;
  auVar67._8_2_ = (short)((ulong)lVar26 >> 0x20);
  auVar67._0_8_ = lVar26;
  auVar66._8_8_ = auVar67._8_8_;
  auVar66._6_2_ = uStack_246;
  auVar66._4_2_ = (short)((ulong)lVar26 >> 0x10);
  auVar66._0_2_ = (undefined2)lVar26;
  auVar66._2_2_ = local_248;
  auVar168._2_2_ = uStack_240;
  auVar168._0_2_ = (short)lVar5;
  auVar168._4_2_ = (short)((ulong)lVar5 >> 0x10);
  auVar168._6_2_ = uStack_23e;
  auVar168._8_2_ = (short)((ulong)lVar5 >> 0x20);
  auVar168._10_2_ = uStack_23c;
  auVar168._12_2_ = (short)((ulong)lVar5 >> 0x30);
  auVar168._14_2_ = uStack_23a;
  auVar124._8_4_ = 0xf1e4078b;
  auVar124._0_8_ = 0xf1e4078bf1e4078b;
  auVar124._12_4_ = 0xf1e4078b;
  auVar80 = pmaddwd(auVar66,auVar124);
  auVar104 = pmaddwd(auVar124,auVar168);
  auVar152._8_4_ = 0x78b0e1c;
  auVar152._0_8_ = 0x78b0e1c078b0e1c;
  auVar152._12_4_ = 0x78b0e1c;
  auVar27 = pmaddwd(auVar66,auVar152);
  auVar142 = pmaddwd(auVar168,auVar152);
  auVar93._0_4_ = auVar80._0_4_ + 0x800 >> 0xc;
  auVar93._4_4_ = auVar80._4_4_ + 0x800 >> 0xc;
  auVar93._8_4_ = auVar80._8_4_ + 0x800 >> 0xc;
  auVar93._12_4_ = auVar80._12_4_ + 0x800 >> 0xc;
  auVar125._0_4_ = auVar104._0_4_ + 0x800 >> 0xc;
  auVar125._4_4_ = auVar104._4_4_ + 0x800 >> 0xc;
  auVar125._8_4_ = auVar104._8_4_ + 0x800 >> 0xc;
  auVar125._12_4_ = auVar104._12_4_ + 0x800 >> 0xc;
  local_198 = packssdw(auVar93,auVar125);
  cos_bit = '\0';
  auVar70._0_4_ = auVar27._0_4_ + 0x800 >> 0xc;
  auVar70._4_4_ = auVar27._4_4_ + 0x800 >> 0xc;
  auVar70._8_4_ = auVar27._8_4_ + 0x800 >> 0xc;
  auVar70._12_4_ = auVar27._12_4_ + 0x800 >> 0xc;
  auVar169._0_4_ = auVar142._0_4_ + 0x800 >> 0xc;
  auVar169._4_4_ = auVar142._4_4_ + 0x800 >> 0xc;
  auVar169._8_4_ = auVar142._8_4_ + 0x800 >> 0xc;
  auVar169._12_4_ = auVar142._12_4_ + 0x800 >> 0xc;
  local_168 = packssdw(auVar70,auVar169);
  local_2d8 = (undefined2)lVar8;
  uStack_2d6 = (undefined2)((ulong)lVar8 >> 0x10);
  uStack_2d4 = (undefined2)((ulong)lVar8 >> 0x20);
  uStack_2d2 = (undefined2)((ulong)lVar8 >> 0x30);
  uStack_2d0 = (undefined2)lVar9;
  uStack_2ce = (undefined2)((ulong)lVar9 >> 0x10);
  uStack_2cc = (undefined2)((ulong)lVar9 >> 0x20);
  uStack_2ca = (undefined2)((ulong)lVar9 >> 0x30);
  auVar74._0_12_ = alVar25._0_12_;
  auVar74._12_2_ = (short)((ulong)lVar6 >> 0x30);
  auVar74._14_2_ = uStack_2d2;
  auVar73._12_4_ = auVar74._12_4_;
  auVar73._0_10_ = alVar25._0_10_;
  auVar73._10_2_ = uStack_2d4;
  auVar72._10_6_ = auVar73._10_6_;
  auVar72._8_2_ = (short)((ulong)lVar6 >> 0x20);
  auVar72._0_8_ = lVar6;
  auVar71._8_8_ = auVar72._8_8_;
  auVar71._6_2_ = uStack_2d6;
  auVar71._4_2_ = (short)((ulong)lVar6 >> 0x10);
  auVar71._0_2_ = (undefined2)lVar6;
  auVar71._2_2_ = local_2d8;
  auVar170._2_2_ = uStack_2d0;
  auVar170._0_2_ = (short)lVar7;
  auVar170._4_2_ = (short)((ulong)lVar7 >> 0x10);
  auVar170._6_2_ = uStack_2ce;
  auVar170._8_2_ = (short)((ulong)lVar7 >> 0x20);
  auVar170._10_2_ = uStack_2cc;
  auVar170._12_2_ = (short)((ulong)lVar7 >> 0x30);
  auVar170._14_2_ = uStack_2ca;
  auVar94._8_4_ = 0xfb5b0f50;
  auVar94._0_8_ = 0xfb5b0f50fb5b0f50;
  auVar94._12_4_ = 0xfb5b0f50;
  auVar104 = pmaddwd(auVar71,auVar94);
  auVar80 = pmaddwd(auVar94,auVar170);
  auVar153._8_4_ = 0xf5004a5;
  auVar153._0_8_ = 0xf5004a50f5004a5;
  auVar153._12_4_ = 0xf5004a5;
  auVar27 = pmaddwd(auVar71,auVar153);
  auVar142 = pmaddwd(auVar170,auVar153);
  auVar126._0_4_ = auVar104._0_4_ + 0x800 >> 0xc;
  auVar126._4_4_ = auVar104._4_4_ + 0x800 >> 0xc;
  auVar126._8_4_ = auVar104._8_4_ + 0x800 >> 0xc;
  auVar126._12_4_ = auVar104._12_4_ + 0x800 >> 0xc;
  auVar95._0_4_ = auVar80._0_4_ + 0x800 >> 0xc;
  auVar95._4_4_ = auVar80._4_4_ + 0x800 >> 0xc;
  auVar95._8_4_ = auVar80._8_4_ + 0x800 >> 0xc;
  auVar95._12_4_ = auVar80._12_4_ + 0x800 >> 0xc;
  local_188 = packssdw(auVar126,auVar95);
  auVar75._0_4_ = auVar27._0_4_ + 0x800 >> 0xc;
  auVar75._4_4_ = auVar27._4_4_ + 0x800 >> 0xc;
  auVar75._8_4_ = auVar27._8_4_ + 0x800 >> 0xc;
  auVar75._12_4_ = auVar27._12_4_ + 0x800 >> 0xc;
  auVar171._0_4_ = auVar142._0_4_ + 0x800 >> 0xc;
  auVar171._4_4_ = auVar142._4_4_ + 0x800 >> 0xc;
  auVar171._8_4_ = auVar142._8_4_ + 0x800 >> 0xc;
  auVar171._12_4_ = auVar142._12_4_ + 0x800 >> 0xc;
  local_178 = packssdw(auVar75,auVar171);
  lVar26 = 0xec8;
  cospi = (int32_t *)0x61f0ec8;
  idct32_high16_stage3_sse2(&local_238);
  auVar157._0_12_ = local_1f8._0_12_;
  auVar157._12_2_ = local_1f8[0]._6_2_;
  auVar157._14_2_ = uStack_1c2;
  auVar156._12_4_ = auVar157._12_4_;
  auVar156._0_10_ = local_1f8._0_10_;
  auVar156._10_2_ = uStack_1c4;
  auVar155._10_6_ = auVar156._10_6_;
  auVar155._0_8_ = local_1f8[0];
  auVar155._8_2_ = local_1f8[0]._4_2_;
  auVar154._8_8_ = auVar155._8_8_;
  auVar154._6_2_ = local_1c8._2_2_;
  auVar154._4_2_ = local_1f8[0]._2_2_;
  auVar154._0_2_ = (undefined2)local_1f8[0];
  auVar154._2_2_ = local_1c8._0_2_;
  auVar127._2_2_ = uStack_1c0;
  auVar127._0_2_ = (short)local_1f8[1];
  auVar127._4_2_ = local_1f8[1]._2_2_;
  auVar127._6_2_ = uStack_1be;
  auVar127._8_2_ = local_1f8[1]._4_2_;
  auVar127._10_2_ = uStack_1bc;
  auVar127._12_2_ = local_1f8[1]._6_2_;
  auVar127._14_2_ = uStack_1ba;
  auVar172._8_4_ = 0xf04f031f;
  auVar172._0_8_ = 0xf04f031ff04f031f;
  auVar172._12_4_ = 0xf04f031f;
  auVar142 = pmaddwd(auVar154,auVar172);
  auVar104 = pmaddwd(auVar172,auVar127);
  auVar186._8_4_ = 0x31f0fb1;
  auVar186._0_8_ = 0x31f0fb1031f0fb1;
  auVar186._12_4_ = 0x31f0fb1;
  auVar80 = pmaddwd(auVar154,auVar186);
  auVar27 = pmaddwd(auVar127,auVar186);
  auVar182._0_4_ = auVar142._0_4_ + 0x800 >> 0xc;
  auVar182._4_4_ = auVar142._4_4_ + 0x800 >> 0xc;
  auVar182._8_4_ = auVar142._8_4_ + 0x800 >> 0xc;
  auVar182._12_4_ = auVar142._12_4_ + 0x800 >> 0xc;
  auVar173._0_4_ = auVar104._0_4_ + 0x800 >> 0xc;
  auVar173._4_4_ = auVar104._4_4_ + 0x800 >> 0xc;
  auVar173._8_4_ = auVar104._8_4_ + 0x800 >> 0xc;
  auVar173._12_4_ = auVar104._12_4_ + 0x800 >> 0xc;
  local_1f8 = (__m128i)packssdw(auVar182,auVar173);
  auVar158._0_4_ = auVar80._0_4_ + 0x800 >> 0xc;
  auVar158._4_4_ = auVar80._4_4_ + 0x800 >> 0xc;
  auVar158._8_4_ = auVar80._8_4_ + 0x800 >> 0xc;
  auVar158._12_4_ = auVar80._12_4_ + 0x800 >> 0xc;
  auVar128._0_4_ = auVar27._0_4_ + 0x800 >> 0xc;
  auVar128._4_4_ = auVar27._4_4_ + 0x800 >> 0xc;
  auVar128._8_4_ = auVar27._8_4_ + 0x800 >> 0xc;
  auVar128._12_4_ = auVar27._12_4_ + 0x800 >> 0xc;
  _local_1c8 = (__m128i)packssdw(auVar158,auVar128);
  auVar132._0_12_ = local_1e8._0_12_;
  auVar132._12_2_ = local_1e8[0]._6_2_;
  auVar132._14_2_ = uStack_1d2;
  auVar131._12_4_ = auVar132._12_4_;
  auVar131._0_10_ = local_1e8._0_10_;
  auVar131._10_2_ = uStack_1d4;
  auVar130._10_6_ = auVar131._10_6_;
  auVar130._0_8_ = local_1e8[0];
  auVar130._8_2_ = local_1e8[0]._4_2_;
  auVar129._8_8_ = auVar130._8_8_;
  auVar129._6_2_ = local_1d8._2_2_;
  auVar129._4_2_ = local_1e8[0]._2_2_;
  auVar129._0_2_ = (undefined2)local_1e8[0];
  auVar129._2_2_ = local_1d8._0_2_;
  auVar76._2_2_ = uStack_1d0;
  auVar76._0_2_ = (short)local_1e8[1];
  auVar76._4_2_ = local_1e8[1]._2_2_;
  auVar76._6_2_ = uStack_1ce;
  auVar76._8_2_ = local_1e8[1]._4_2_;
  auVar76._10_2_ = uStack_1cc;
  auVar76._12_2_ = local_1e8[1]._6_2_;
  auVar76._14_2_ = uStack_1ca;
  auVar96._8_4_ = 0xf71c0d4e;
  auVar96._0_8_ = 0xf71c0d4ef71c0d4e;
  auVar96._12_4_ = 0xf71c0d4e;
  auVar142 = pmaddwd(auVar129,auVar96);
  auVar80 = pmaddwd(auVar96,auVar76);
  auVar174._8_4_ = 0xd4e08e4;
  auVar174._0_8_ = 0xd4e08e40d4e08e4;
  auVar174._12_4_ = 0xd4e08e4;
  auVar104 = pmaddwd(auVar129,auVar174);
  auVar27 = pmaddwd(auVar76,auVar174);
  auVar159._0_4_ = auVar142._0_4_ + 0x800 >> 0xc;
  auVar159._4_4_ = auVar142._4_4_ + 0x800 >> 0xc;
  auVar159._8_4_ = auVar142._8_4_ + 0x800 >> 0xc;
  auVar159._12_4_ = auVar142._12_4_ + 0x800 >> 0xc;
  auVar97._0_4_ = auVar80._0_4_ + 0x800 >> 0xc;
  auVar97._4_4_ = auVar80._4_4_ + 0x800 >> 0xc;
  auVar97._8_4_ = auVar80._8_4_ + 0x800 >> 0xc;
  auVar97._12_4_ = auVar80._12_4_ + 0x800 >> 0xc;
  local_1e8 = (__m128i)packssdw(auVar159,auVar97);
  auVar133._0_4_ = auVar104._0_4_ + 0x800 >> 0xc;
  auVar133._4_4_ = auVar104._4_4_ + 0x800 >> 0xc;
  auVar133._8_4_ = auVar104._8_4_ + 0x800 >> 0xc;
  auVar133._12_4_ = auVar104._12_4_ + 0x800 >> 0xc;
  auVar77._0_4_ = auVar27._0_4_ + 0x800 >> 0xc;
  auVar77._4_4_ = auVar27._4_4_ + 0x800 >> 0xc;
  auVar77._8_4_ = auVar27._8_4_ + 0x800 >> 0xc;
  auVar77._12_4_ = auVar27._12_4_ + 0x800 >> 0xc;
  _local_1d8 = (__m128i)packssdw(auVar133,auVar77);
  auVar27 = paddsw(local_1b8,local_1a8);
  local_1a8 = psubsw(local_1b8,local_1a8);
  auVar80 = psubsw(local_188,local_198);
  local_188 = paddsw(local_188,local_198);
  auVar104 = paddsw(local_178,local_168);
  local_168 = psubsw(local_178,local_168);
  auVar142 = psubsw(local_148,local_158);
  local_148 = paddsw(local_148,local_158);
  alVar178[1] = lVar26;
  alVar178[0] = extraout_RDX;
  local_1b8 = auVar27;
  local_198 = auVar80;
  local_178 = auVar104;
  local_158 = auVar142;
  idct32_high16_stage4_sse2(&local_238,cospi,alVar178,cos_bit);
  auVar163._0_12_ = local_238._0_12_;
  auVar163._12_2_ = local_238[0]._6_2_;
  auVar163._14_2_ = uStack_222;
  auVar162._12_4_ = auVar163._12_4_;
  auVar162._0_10_ = local_238._0_10_;
  auVar162._10_2_ = uStack_224;
  auVar161._10_6_ = auVar162._10_6_;
  auVar161._0_8_ = local_238[0];
  auVar161._8_2_ = local_238[0]._4_2_;
  auVar160._8_8_ = auVar161._8_8_;
  auVar160._6_2_ = local_228._2_2_;
  auVar160._4_2_ = local_238[0]._2_2_;
  auVar160._0_2_ = (undefined2)local_238[0];
  auVar160._2_2_ = local_228._0_2_;
  auVar134._2_2_ = uStack_220;
  auVar134._0_2_ = (short)local_238[1];
  auVar134._4_2_ = local_238[1]._2_2_;
  auVar134._6_2_ = uStack_21e;
  auVar134._8_2_ = local_238[1]._4_2_;
  auVar134._10_2_ = uStack_21c;
  auVar134._12_2_ = local_238[1]._6_2_;
  auVar134._14_2_ = uStack_21a;
  auVar175._8_4_ = 0xb500b50;
  auVar175._0_8_ = 0xb500b500b500b50;
  auVar175._12_4_ = 0xb500b50;
  auVar142 = pmaddwd(auVar160,auVar175);
  auVar104 = pmaddwd(auVar175,auVar134);
  auVar187._8_4_ = 0xf4b00b50;
  auVar187._0_8_ = 0xf4b00b50f4b00b50;
  auVar187._12_4_ = 0xf4b00b50;
  auVar80 = pmaddwd(auVar160,auVar187);
  auVar27 = pmaddwd(auVar134,auVar187);
  auVar183._0_4_ = auVar142._0_4_ + 0x800 >> 0xc;
  auVar183._4_4_ = auVar142._4_4_ + 0x800 >> 0xc;
  auVar183._8_4_ = auVar142._8_4_ + 0x800 >> 0xc;
  auVar183._12_4_ = auVar142._12_4_ + 0x800 >> 0xc;
  auVar176._0_4_ = auVar104._0_4_ + 0x800 >> 0xc;
  auVar176._4_4_ = auVar104._4_4_ + 0x800 >> 0xc;
  auVar176._8_4_ = auVar104._8_4_ + 0x800 >> 0xc;
  auVar176._12_4_ = auVar104._12_4_ + 0x800 >> 0xc;
  local_238 = (__m128i)packssdw(auVar183,auVar176);
  auVar164._0_4_ = auVar80._0_4_ + 0x800 >> 0xc;
  auVar164._4_4_ = auVar80._4_4_ + 0x800 >> 0xc;
  auVar164._8_4_ = auVar80._8_4_ + 0x800 >> 0xc;
  auVar164._12_4_ = auVar80._12_4_ + 0x800 >> 0xc;
  auVar135._0_4_ = auVar27._0_4_ + 0x800 >> 0xc;
  auVar135._4_4_ = auVar27._4_4_ + 0x800 >> 0xc;
  auVar135._8_4_ = auVar27._8_4_ + 0x800 >> 0xc;
  auVar135._12_4_ = auVar27._12_4_ + 0x800 >> 0xc;
  _local_228 = (__m128i)packssdw(auVar164,auVar135);
  auVar139._0_12_ = local_218._0_12_;
  auVar139._12_2_ = local_218[0]._6_2_;
  auVar139._14_2_ = uStack_202;
  auVar138._12_4_ = auVar139._12_4_;
  auVar138._0_10_ = local_218._0_10_;
  auVar138._10_2_ = uStack_204;
  auVar137._10_6_ = auVar138._10_6_;
  auVar137._0_8_ = local_218[0];
  auVar137._8_2_ = local_218[0]._4_2_;
  auVar136._8_8_ = auVar137._8_8_;
  auVar136._6_2_ = local_208._2_2_;
  auVar136._4_2_ = local_218[0]._2_2_;
  auVar136._0_2_ = (undefined2)local_218[0];
  auVar136._2_2_ = local_208._0_2_;
  auVar78._2_2_ = uStack_200;
  auVar78._0_2_ = (short)local_218[1];
  auVar78._4_2_ = local_218[1]._2_2_;
  auVar78._6_2_ = uStack_1fe;
  auVar78._8_2_ = local_218[1]._4_2_;
  auVar78._10_2_ = uStack_1fc;
  auVar78._12_2_ = local_218[1]._6_2_;
  auVar78._14_2_ = uStack_1fa;
  auVar98._8_4_ = 0xf138061f;
  auVar98._0_8_ = 0xf138061ff138061f;
  auVar98._12_4_ = 0xf138061f;
  auVar142 = pmaddwd(auVar136,auVar98);
  auVar80 = pmaddwd(auVar98,auVar78);
  auVar177._8_4_ = 0x61f0ec8;
  auVar177._0_8_ = 0x61f0ec8061f0ec8;
  auVar177._12_4_ = 0x61f0ec8;
  auVar104 = pmaddwd(auVar136,auVar177);
  auVar27 = pmaddwd(auVar78,auVar177);
  auVar165._0_4_ = auVar142._0_4_ + 0x800 >> 0xc;
  auVar165._4_4_ = auVar142._4_4_ + 0x800 >> 0xc;
  auVar165._8_4_ = auVar142._8_4_ + 0x800 >> 0xc;
  auVar165._12_4_ = auVar142._12_4_ + 0x800 >> 0xc;
  auVar99._0_4_ = auVar80._0_4_ + 0x800 >> 0xc;
  auVar99._4_4_ = auVar80._4_4_ + 0x800 >> 0xc;
  auVar99._8_4_ = auVar80._8_4_ + 0x800 >> 0xc;
  auVar99._12_4_ = auVar80._12_4_ + 0x800 >> 0xc;
  local_218 = (__m128i)packssdw(auVar165,auVar99);
  auVar140._0_4_ = auVar104._0_4_ + 0x800 >> 0xc;
  auVar140._4_4_ = auVar104._4_4_ + 0x800 >> 0xc;
  auVar140._8_4_ = auVar104._8_4_ + 0x800 >> 0xc;
  auVar140._12_4_ = auVar104._12_4_ + 0x800 >> 0xc;
  auVar79._0_4_ = auVar27._0_4_ + 0x800 >> 0xc;
  auVar79._4_4_ = auVar27._4_4_ + 0x800 >> 0xc;
  auVar79._8_4_ = auVar27._8_4_ + 0x800 >> 0xc;
  auVar79._12_4_ = auVar27._12_4_ + 0x800 >> 0xc;
  _local_208 = (__m128i)packssdw(auVar140,auVar79);
  auVar27 = paddsw((undefined1  [16])local_1f8,(undefined1  [16])local_1e8);
  local_1e8 = (__m128i)psubsw((undefined1  [16])local_1f8,(undefined1  [16])local_1e8);
  auVar80 = paddsw((undefined1  [16])_local_1c8,(undefined1  [16])_local_1d8);
  _local_1d8 = (__m128i)psubsw((undefined1  [16])_local_1c8,(undefined1  [16])_local_1d8);
  alVar204[1] = lVar26;
  alVar204[0] = extraout_RDX_00;
  local_1f8 = (__m128i)auVar27;
  _local_1c8 = (__m128i)auVar80;
  idct32_high24_stage5_sse2(&local_238,cospi,alVar204,cos_bit);
  alVar178 = (__m128i)paddsw((undefined1  [16])local_238,(undefined1  [16])_local_208);
  _local_208 = (__m128i)psubsw((undefined1  [16])local_238,(undefined1  [16])_local_208);
  auVar27 = paddsw((undefined1  [16])_local_228,(undefined1  [16])local_218);
  local_218 = (__m128i)psubsw((undefined1  [16])_local_228,(undefined1  [16])local_218);
  alVar205[1] = lVar26;
  alVar205[0] = extraout_RDX_01;
  local_238 = alVar178;
  _local_228 = (__m128i)auVar27;
  idct32_high28_stage6_sse2(&local_238,cospi,alVar205,cos_bit);
  alVar206[1] = lVar26;
  alVar206[0] = extraout_RDX_02;
  idct32_stage7_sse2(&local_238,cospi,alVar206,cos_bit);
  alVar207[1] = lVar26;
  alVar207[0] = extraout_RDX_03;
  idct32_stage8_sse2(&local_238,cospi,alVar207,cos_bit);
  idct32_stage9_sse2(output,&local_238);
  return;
}

Assistant:

static void idct32_sse2(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m128i cospi_p62_m02 = pair_set_epi16(cospi[62], -cospi[2]);
  const __m128i cospi_p02_p62 = pair_set_epi16(cospi[2], cospi[62]);
  const __m128i cospi_p30_m34 = pair_set_epi16(cospi[30], -cospi[34]);
  const __m128i cospi_p34_p30 = pair_set_epi16(cospi[34], cospi[30]);
  const __m128i cospi_p46_m18 = pair_set_epi16(cospi[46], -cospi[18]);
  const __m128i cospi_p18_p46 = pair_set_epi16(cospi[18], cospi[46]);
  const __m128i cospi_p14_m50 = pair_set_epi16(cospi[14], -cospi[50]);
  const __m128i cospi_p50_p14 = pair_set_epi16(cospi[50], cospi[14]);
  const __m128i cospi_p54_m10 = pair_set_epi16(cospi[54], -cospi[10]);
  const __m128i cospi_p10_p54 = pair_set_epi16(cospi[10], cospi[54]);
  const __m128i cospi_p22_m42 = pair_set_epi16(cospi[22], -cospi[42]);
  const __m128i cospi_p42_p22 = pair_set_epi16(cospi[42], cospi[22]);
  const __m128i cospi_p38_m26 = pair_set_epi16(cospi[38], -cospi[26]);
  const __m128i cospi_p26_p38 = pair_set_epi16(cospi[26], cospi[38]);
  const __m128i cospi_p06_m58 = pair_set_epi16(cospi[6], -cospi[58]);
  const __m128i cospi_p58_p06 = pair_set_epi16(cospi[58], cospi[6]);
  const __m128i cospi_p60_m04 = pair_set_epi16(cospi[60], -cospi[4]);
  const __m128i cospi_p04_p60 = pair_set_epi16(cospi[4], cospi[60]);
  const __m128i cospi_p28_m36 = pair_set_epi16(cospi[28], -cospi[36]);
  const __m128i cospi_p36_p28 = pair_set_epi16(cospi[36], cospi[28]);
  const __m128i cospi_p44_m20 = pair_set_epi16(cospi[44], -cospi[20]);
  const __m128i cospi_p20_p44 = pair_set_epi16(cospi[20], cospi[44]);
  const __m128i cospi_p12_m52 = pair_set_epi16(cospi[12], -cospi[52]);
  const __m128i cospi_p52_p12 = pair_set_epi16(cospi[52], cospi[12]);
  const __m128i cospi_p56_m08 = pair_set_epi16(cospi[56], -cospi[8]);
  const __m128i cospi_p08_p56 = pair_set_epi16(cospi[8], cospi[56]);
  const __m128i cospi_p24_m40 = pair_set_epi16(cospi[24], -cospi[40]);
  const __m128i cospi_p40_p24 = pair_set_epi16(cospi[40], cospi[24]);
  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);
  const __m128i cospi_p48_m16 = pair_set_epi16(cospi[48], -cospi[16]);
  const __m128i cospi_p16_p48 = pair_set_epi16(cospi[16], cospi[48]);

  // stage 1
  __m128i x[32];
  x[0] = input[0];
  x[1] = input[16];
  x[2] = input[8];
  x[3] = input[24];
  x[4] = input[4];
  x[5] = input[20];
  x[6] = input[12];
  x[7] = input[28];
  x[8] = input[2];
  x[9] = input[18];
  x[10] = input[10];
  x[11] = input[26];
  x[12] = input[6];
  x[13] = input[22];
  x[14] = input[14];
  x[15] = input[30];
  x[16] = input[1];
  x[17] = input[17];
  x[18] = input[9];
  x[19] = input[25];
  x[20] = input[5];
  x[21] = input[21];
  x[22] = input[13];
  x[23] = input[29];
  x[24] = input[3];
  x[25] = input[19];
  x[26] = input[11];
  x[27] = input[27];
  x[28] = input[7];
  x[29] = input[23];
  x[30] = input[15];
  x[31] = input[31];

  // stage 2
  btf_16_sse2(cospi_p62_m02, cospi_p02_p62, x[16], x[31], x[16], x[31]);
  btf_16_sse2(cospi_p30_m34, cospi_p34_p30, x[17], x[30], x[17], x[30]);
  btf_16_sse2(cospi_p46_m18, cospi_p18_p46, x[18], x[29], x[18], x[29]);
  btf_16_sse2(cospi_p14_m50, cospi_p50_p14, x[19], x[28], x[19], x[28]);
  btf_16_sse2(cospi_p54_m10, cospi_p10_p54, x[20], x[27], x[20], x[27]);
  btf_16_sse2(cospi_p22_m42, cospi_p42_p22, x[21], x[26], x[21], x[26]);
  btf_16_sse2(cospi_p38_m26, cospi_p26_p38, x[22], x[25], x[22], x[25]);
  btf_16_sse2(cospi_p06_m58, cospi_p58_p06, x[23], x[24], x[23], x[24]);

  // stage 3
  btf_16_sse2(cospi_p60_m04, cospi_p04_p60, x[8], x[15], x[8], x[15]);
  btf_16_sse2(cospi_p28_m36, cospi_p36_p28, x[9], x[14], x[9], x[14]);
  btf_16_sse2(cospi_p44_m20, cospi_p20_p44, x[10], x[13], x[10], x[13]);
  btf_16_sse2(cospi_p12_m52, cospi_p52_p12, x[11], x[12], x[11], x[12]);
  idct32_high16_stage3_sse2(x);

  // stage 4
  btf_16_sse2(cospi_p56_m08, cospi_p08_p56, x[4], x[7], x[4], x[7]);
  btf_16_sse2(cospi_p24_m40, cospi_p40_p24, x[5], x[6], x[5], x[6]);
  btf_16_adds_subs_sse2(x[8], x[9]);
  btf_16_subs_adds_sse2(x[11], x[10]);
  btf_16_adds_subs_sse2(x[12], x[13]);
  btf_16_subs_adds_sse2(x[15], x[14]);
  idct32_high16_stage4_sse2(x, cospi, __rounding, cos_bit);

  // stage 5
  btf_16_sse2(cospi_p32_p32, cospi_p32_m32, x[0], x[1], x[0], x[1]);
  btf_16_sse2(cospi_p48_m16, cospi_p16_p48, x[2], x[3], x[2], x[3]);
  btf_16_adds_subs_sse2(x[4], x[5]);
  btf_16_adds_subs_sse2(x[7], x[6]);
  idct32_high24_stage5_sse2(x, cospi, __rounding, cos_bit);

  // stage 6
  btf_16_adds_subs_sse2(x[0], x[3]);
  btf_16_adds_subs_sse2(x[1], x[2]);
  idct32_high28_stage6_sse2(x, cospi, __rounding, cos_bit);

  // stage 7~8
  idct32_stage7_sse2(x, cospi, __rounding, cos_bit);
  idct32_stage8_sse2(x, cospi, __rounding, cos_bit);
  idct32_stage9_sse2(output, x);
}